

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  _Bool _Var1;
  CURLcode CVar2;
  CURLcode CVar3;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  sigpipe_ignore pipe_st;
  curl_socket_t local_e4;
  connectdata *local_e0;
  size_t local_d8;
  sigpipe_ignore local_d0;
  
  local_e0 = (connectdata *)0x0;
  _Var1 = Curl_is_in_callback(data);
  CVar2 = CURLE_RECURSIVE_API_CALL;
  if (!_Var1) {
    CVar2 = easy_connection(data,&local_e4,&local_e0);
    if (CVar2 == CURLE_OK) {
      if (data->conn == (connectdata *)0x0) {
        Curl_attach_connnection(data,local_e0);
      }
      *n = 0;
      sigpipe_ignore(data,&local_d0);
      CVar3 = Curl_write(data,local_e4,buffer,buflen,(ssize_t *)&local_d8);
      if (local_d0.no_signal == false) {
        sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
      }
      if (local_d8 == 0xffffffffffffffff) {
        CVar2 = CURLE_SEND_ERROR;
      }
      else {
        CVar2 = CURLE_AGAIN;
        if (CVar3 != CURLE_OK || local_d8 != 0) {
          *n = local_d8;
          CVar2 = CVar3;
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  if(Curl_is_in_callback(data))
    return CURLE_RECURSIVE_API_CALL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connnection(data, c);

  *n = 0;
  sigpipe_ignore(data, &pipe_st);
  result = Curl_write(data, sfd, buffer, buflen, &n1);
  sigpipe_restore(&pipe_st);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return result;
}